

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdlFbInterfaces.h
# Opt level: O3

void __thiscall
Firebird::
IDisposableBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>
::IDisposableBaseImpl
          (IDisposableBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>
           *this)

{
  IVersionedBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
  ::IVersionedBaseImpl
            (&(this->
              super_Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>
              ).
              super_IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
              .
              super_IVersionedBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
            );
  (this->
  super_Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>
  ).
  super_IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
  ._vptr_IVersionedImpl = (_func_int **)&PTR__IVersionedImpl_00210eb8;
  if (IDisposableBaseImpl<Firebird::ThrowStatusWrapper,Firebird::ThrowStatusWrapper,Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,Firebird::ThrowStatusWrapper,Firebird::Inherit<Firebird::IStatus>>>>
      ::IDisposableBaseImpl(Firebird::DoNotInherit)::vTable == '\0') {
    Firebird::IDisposableBaseImpl();
  }
  *(VTableImpl **)
   ((long)&(this->
           super_Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>
           ).
           super_IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
           .
           super_IVersionedBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
           .super_Inherit<Firebird::IStatus>.super_IStatus.super_IDisposable.super_IVersioned + 8) =
       &IDisposableBaseImpl::vTable;
  return;
}

Assistant:

IDisposableBaseImpl(DoNotInherit = DoNotInherit())
		{
			static struct VTableImpl : Base::VTable
			{
				VTableImpl()
				{
					this->version = Base::VERSION;
					this->dispose = &Name::cloopdisposeDispatcher;
				}
			} vTable;

			this->cloopVTable = &vTable;
		}